

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::IsImportedSharedLibWithoutSOName(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ImportInfo *pIVar3;
  ImportInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsImported(this);
  if (((bVar1) && (TVar2 = GetType(this), TVar2 == SHARED_LIBRARY)) &&
     (pIVar3 = GetImportInfo(this,config), pIVar3 != (ImportInfo *)0x0)) {
    this_local._7_1_ = (bool)(pIVar3->NoSOName & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::IsImportedSharedLibWithoutSOName(
                                          const std::string& config) const
{
  if(this->IsImported() && this->GetType() == cmState::SHARED_LIBRARY)
    {
    if(cmGeneratorTarget::ImportInfo const* info =
       this->GetImportInfo(config))
      {
      return info->NoSOName;
      }
    }
  return false;
}